

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

Float sRGBRoundTrip(Float v,Float dither)

{
  byte bVar1;
  Float FVar2;
  
  FVar2 = 0.0;
  if ((0.0 <= v) && (FVar2 = 1.0, v <= 1.0)) {
    bVar1 = pbrt::LinearToSRGB8(v,dither);
    FVar2 = (Float)(&pbrt::SRGBToLinearLUT)[bVar1];
  }
  return FVar2;
}

Assistant:

static Float sRGBRoundTrip(Float v, Float dither = 0) {
    if (v < 0)
        return 0;
    else if (v > 1)
        return 1;
    uint8_t encoded = LinearToSRGB8(v, dither);
    return SRGB8ToLinear(encoded);
}